

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O1

float ncnn::get_value_bounded(Mat *image,int x,int y,int padding_mode,int align_corner)

{
  int w;
  int w_00;
  uint uVar1;
  uint uVar2;
  float fVar3;
  
  w = image->w;
  uVar1 = compute_coord(x,w,padding_mode,align_corner);
  w_00 = image->h;
  uVar2 = compute_coord(y,w_00,padding_mode,align_corner);
  fVar3 = 0.0;
  if ((((int)uVar2 < w_00) && ((int)uVar1 < w)) && (-1 < (int)(uVar2 | uVar1))) {
    fVar3 = *(float *)((long)image->data +
                      (long)(int)uVar1 * 4 + (long)(int)uVar2 * (long)w * image->elemsize);
  }
  return fVar3;
}

Assistant:

static float get_value_bounded(const Mat& image, int x, int y, int padding_mode, int align_corner)
{
    x = compute_coord(x, image.w, padding_mode, align_corner);
    y = compute_coord(y, image.h, padding_mode, align_corner);

    return get_value_bounded(image, x, y);
}